

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  byte bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  ulong uVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  float fVar45;
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar47 [64];
  undefined1 auVar51 [16];
  uint uVar53;
  uint uVar54;
  uint uVar55;
  undefined1 auVar52 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 local_14a8 [16];
  long local_1498;
  long local_1490;
  ulong local_1488;
  NodeRef *local_1480;
  Scene *local_1478;
  undefined1 (*local_1470) [16];
  RTCFilterFunctionNArguments args;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined4 local_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_1480 = stack + 1;
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11f8._4_4_ = fVar1;
  local_11f8._0_4_ = fVar1;
  local_11f8._8_4_ = fVar1;
  local_11f8._12_4_ = fVar1;
  local_11f8._16_4_ = fVar1;
  local_11f8._20_4_ = fVar1;
  local_11f8._24_4_ = fVar1;
  local_11f8._28_4_ = fVar1;
  auVar34 = ZEXT3264(local_11f8);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = fVar45;
  local_1218._0_4_ = fVar45;
  local_1218._8_4_ = fVar45;
  local_1218._12_4_ = fVar45;
  local_1218._16_4_ = fVar45;
  local_1218._20_4_ = fVar45;
  local_1218._24_4_ = fVar45;
  local_1218._28_4_ = fVar45;
  auVar36 = ZEXT3264(local_1218);
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = fVar48;
  local_1238._0_4_ = fVar48;
  local_1238._8_4_ = fVar48;
  local_1238._12_4_ = fVar48;
  local_1238._16_4_ = fVar48;
  local_1238._20_4_ = fVar48;
  local_1238._24_4_ = fVar48;
  local_1238._28_4_ = fVar48;
  auVar40 = ZEXT3264(local_1238);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1488 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar18 = local_1488 ^ 0x20;
  local_1258._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1258._8_4_ = -fVar1;
  local_1258._12_4_ = -fVar1;
  local_1258._16_4_ = -fVar1;
  local_1258._20_4_ = -fVar1;
  local_1258._24_4_ = -fVar1;
  local_1258._28_4_ = -fVar1;
  auVar44 = ZEXT3264(local_1258);
  local_1278._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_1278._8_4_ = -fVar45;
  local_1278._12_4_ = -fVar45;
  local_1278._16_4_ = -fVar45;
  local_1278._20_4_ = -fVar45;
  local_1278._24_4_ = -fVar45;
  local_1278._28_4_ = -fVar45;
  auVar47 = ZEXT3264(local_1278);
  iVar2 = (tray->tnear).field_0.i[k];
  local_1298._4_4_ = iVar2;
  local_1298._0_4_ = iVar2;
  local_1298._8_4_ = iVar2;
  local_1298._12_4_ = iVar2;
  local_1298._16_4_ = iVar2;
  local_1298._20_4_ = iVar2;
  local_1298._24_4_ = iVar2;
  local_1298._28_4_ = iVar2;
  auVar52 = ZEXT3264(local_1298);
  local_12b8._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  local_12b8._8_4_ = -fVar48;
  local_12b8._12_4_ = -fVar48;
  local_12b8._16_4_ = -fVar48;
  local_12b8._20_4_ = -fVar48;
  local_12b8._24_4_ = -fVar48;
  local_12b8._28_4_ = -fVar48;
  auVar57 = ZEXT3264(local_12b8);
  iVar2 = (tray->tfar).field_0.i[k];
  local_12d8._4_4_ = iVar2;
  local_12d8._0_4_ = iVar2;
  local_12d8._8_4_ = iVar2;
  local_12d8._12_4_ = iVar2;
  local_12d8._16_4_ = iVar2;
  local_12d8._20_4_ = iVar2;
  local_12d8._24_4_ = iVar2;
  local_12d8._28_4_ = iVar2;
  auVar60 = ZEXT3264(local_12d8);
  local_1470 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar22 = true;
LAB_005cd761:
  do {
    sVar19 = local_1480[-1].ptr;
    local_1480 = local_1480 + -1;
    while ((sVar19 & 8) == 0) {
      uVar12 = sVar19 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar26._4_4_ = uVar3;
      auVar26._0_4_ = uVar3;
      auVar26._8_4_ = uVar3;
      auVar26._12_4_ = uVar3;
      auVar26._16_4_ = uVar3;
      auVar26._20_4_ = uVar3;
      auVar26._24_4_ = uVar3;
      auVar26._28_4_ = uVar3;
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + local_1488),auVar26,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + local_1488));
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar34._0_32_,auVar44._0_32_);
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar14),auVar26,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar14));
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar36._0_32_,auVar47._0_32_);
      auVar8 = vpmaxsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar24));
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar20),auVar26,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar20));
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar40._0_32_,auVar57._0_32_);
      auVar9 = vpmaxsd_avx2(ZEXT1632(auVar23),auVar52._0_32_);
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + uVar18),auVar26,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + uVar18));
      auVar8 = vpmaxsd_avx2(auVar8,auVar9);
      auVar24 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar14 ^ 0x20)),auVar26,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar14 ^ 0x20)));
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar34._0_32_,auVar44._0_32_);
      auVar24 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar36._0_32_,auVar47._0_32_);
      auVar9 = vpminsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar24));
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar12 + 0x100 + (uVar20 ^ 0x20)),auVar26,
                                *(undefined1 (*) [32])(uVar12 + 0x40 + (uVar20 ^ 0x20)));
      auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar40._0_32_,auVar57._0_32_);
      auVar10 = vpminsd_avx2(ZEXT1632(auVar23),auVar60._0_32_);
      auVar9 = vpminsd_avx2(auVar9,auVar10);
      auVar8 = vcmpps_avx(auVar8,auVar9,2);
      if (((uint)sVar19 & 7) == 6) {
        auVar9 = vcmpps_avx(*(undefined1 (*) [32])(uVar12 + 0x1c0),auVar26,2);
        auVar10 = vcmpps_avx(auVar26,*(undefined1 (*) [32])(uVar12 + 0x1e0),1);
        auVar9 = vandps_avx(auVar9,auVar10);
        auVar8 = vandps_avx(auVar9,auVar8);
        auVar23 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
      }
      else {
        auVar23 = vpackssdw_avx(auVar8._0_16_,auVar8._16_16_);
      }
      auVar23 = vpsllw_avx(auVar23,0xf);
      if ((((((((auVar23 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar23 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar23 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar23 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar23[0xf])
      {
        bVar22 = local_1480 != stack;
        if (!bVar22) {
          return bVar22;
        }
        goto LAB_005cd761;
      }
      auVar23 = vpacksswb_avx(auVar23,auVar23);
      bVar7 = SUB161(auVar23 >> 7,0) & 1 | (SUB161(auVar23 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar23 >> 0x17,0) & 1) << 2 | (SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar23 >> 0x27,0) & 1) << 4 | (SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar23 >> 0x37,0) & 1) << 6 | SUB161(auVar23 >> 0x3f,0) << 7;
      lVar13 = 0;
      for (uVar15 = (ulong)bVar7; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
        lVar13 = lVar13 + 1;
      }
      sVar19 = *(size_t *)(uVar12 + lVar13 * 8);
      uVar17 = bVar7 - 1 & (uint)bVar7;
      uVar15 = (ulong)uVar17;
      if (uVar17 != 0) {
        local_1480->ptr = sVar19;
        lVar13 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        uVar17 = uVar17 - 1 & uVar17;
        uVar15 = (ulong)uVar17;
        bVar21 = uVar17 == 0;
        while( true ) {
          local_1480 = local_1480 + 1;
          sVar19 = *(size_t *)(uVar12 + lVar13 * 8);
          if (bVar21) break;
          local_1480->ptr = sVar19;
          lVar13 = 0;
          for (uVar11 = uVar15; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            lVar13 = lVar13 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          bVar21 = uVar15 == 0;
        }
      }
    }
    local_1490 = (ulong)((uint)sVar19 & 0xf) - 8;
    if (local_1490 != 0) {
      uVar12 = sVar19 & 0xfffffffffffffff0;
      local_1498 = 0;
      do {
        lVar13 = local_1498 * 0x140;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar24._4_4_ = uVar3;
        auVar24._0_4_ = uVar3;
        auVar24._8_4_ = uVar3;
        auVar24._12_4_ = uVar3;
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x90 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + lVar13));
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0xa0 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x10 + lVar13));
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0xb0 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x20 + lVar13));
        auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0xc0 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x30 + lVar13));
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0xd0 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x40 + lVar13));
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0xe0 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x50 + lVar13));
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0xf0 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x60 + lVar13));
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x100 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x70 + lVar13));
        auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x110 + lVar13),auVar24,
                                  *(undefined1 (*) [16])(uVar12 + 0x80 + lVar13));
        auVar24 = vsubps_avx(auVar30,auVar23);
        auVar23 = vsubps_avx(auVar33,auVar38);
        auVar38 = vsubps_avx(auVar43,auVar46);
        auVar46 = vsubps_avx(auVar59,auVar30);
        auVar59 = vsubps_avx(auVar32,auVar33);
        auVar32 = vsubps_avx(auVar25,auVar43);
        auVar25._0_4_ = auVar23._0_4_ * auVar32._0_4_;
        auVar25._4_4_ = auVar23._4_4_ * auVar32._4_4_;
        auVar25._8_4_ = auVar23._8_4_ * auVar32._8_4_;
        auVar25._12_4_ = auVar23._12_4_ * auVar32._12_4_;
        local_1398 = vfmsub231ps_fma(auVar25,auVar59,auVar38);
        auVar27._0_4_ = auVar38._0_4_ * auVar46._0_4_;
        auVar27._4_4_ = auVar38._4_4_ * auVar46._4_4_;
        auVar27._8_4_ = auVar38._8_4_ * auVar46._8_4_;
        auVar27._12_4_ = auVar38._12_4_ * auVar46._12_4_;
        local_1388 = vfmsub231ps_fma(auVar27,auVar32,auVar24);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar41._4_4_ = uVar3;
        auVar41._0_4_ = uVar3;
        auVar41._8_4_ = uVar3;
        auVar41._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar63._4_4_ = uVar3;
        auVar63._0_4_ = uVar3;
        auVar63._8_4_ = uVar3;
        auVar63._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar66._4_4_ = uVar3;
        auVar66._0_4_ = uVar3;
        auVar66._8_4_ = uVar3;
        auVar66._12_4_ = uVar3;
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar58._4_4_ = fVar1;
        auVar58._0_4_ = fVar1;
        auVar58._8_4_ = fVar1;
        auVar58._12_4_ = fVar1;
        auVar30 = vsubps_avx(auVar30,auVar41);
        fVar45 = *(float *)(ray + k * 4 + 0x50);
        auVar62._4_4_ = fVar45;
        auVar62._0_4_ = fVar45;
        auVar62._8_4_ = fVar45;
        auVar62._12_4_ = fVar45;
        auVar33 = vsubps_avx(auVar33,auVar63);
        fVar48 = *(float *)(ray + k * 4 + 0x60);
        auVar64._4_4_ = fVar48;
        auVar64._0_4_ = fVar48;
        auVar64._8_4_ = fVar48;
        auVar64._12_4_ = fVar48;
        auVar43 = vsubps_avx(auVar43,auVar66);
        auVar37._0_4_ = fVar1 * auVar33._0_4_;
        auVar37._4_4_ = fVar1 * auVar33._4_4_;
        auVar37._8_4_ = fVar1 * auVar33._8_4_;
        auVar37._12_4_ = fVar1 * auVar33._12_4_;
        auVar25 = vfmsub231ps_fma(auVar37,auVar30,auVar62);
        auVar61._0_4_ = auVar32._0_4_ * auVar25._0_4_;
        auVar61._4_4_ = auVar32._4_4_ * auVar25._4_4_;
        auVar61._8_4_ = auVar32._8_4_ * auVar25._8_4_;
        auVar61._12_4_ = auVar32._12_4_ * auVar25._12_4_;
        auVar56._0_4_ = auVar38._0_4_ * auVar25._0_4_;
        auVar56._4_4_ = auVar38._4_4_ * auVar25._4_4_;
        auVar56._8_4_ = auVar38._8_4_ * auVar25._8_4_;
        auVar56._12_4_ = auVar38._12_4_ * auVar25._12_4_;
        auVar38._0_4_ = fVar48 * auVar30._0_4_;
        auVar38._4_4_ = fVar48 * auVar30._4_4_;
        auVar38._8_4_ = fVar48 * auVar30._8_4_;
        auVar38._12_4_ = fVar48 * auVar30._12_4_;
        auVar32 = vfmsub231ps_fma(auVar38,auVar43,auVar58);
        auVar38 = vfmadd231ps_fma(auVar61,auVar32,auVar59);
        auVar32 = vfmadd231ps_fma(auVar56,auVar23,auVar32);
        auVar39._0_4_ = auVar59._0_4_ * auVar24._0_4_;
        auVar39._4_4_ = auVar59._4_4_ * auVar24._4_4_;
        auVar39._8_4_ = auVar59._8_4_ * auVar24._8_4_;
        auVar39._12_4_ = auVar59._12_4_ * auVar24._12_4_;
        local_1378 = vfmsub231ps_fma(auVar39,auVar46,auVar23);
        auVar23._0_4_ = fVar45 * auVar43._0_4_;
        auVar23._4_4_ = fVar45 * auVar43._4_4_;
        auVar23._8_4_ = fVar45 * auVar43._8_4_;
        auVar23._12_4_ = fVar45 * auVar43._12_4_;
        auVar25 = vfmsub231ps_fma(auVar23,auVar33,auVar64);
        auVar65._0_4_ = fVar48 * local_1378._0_4_;
        auVar65._4_4_ = fVar48 * local_1378._4_4_;
        auVar65._8_4_ = fVar48 * local_1378._8_4_;
        auVar65._12_4_ = fVar48 * local_1378._12_4_;
        auVar23 = vfmadd231ps_fma(auVar65,local_1388,auVar62);
        auVar59 = vfmadd231ps_fma(auVar23,local_1398,auVar58);
        auVar51._8_4_ = 0x80000000;
        auVar51._0_8_ = 0x8000000080000000;
        auVar51._12_4_ = 0x80000000;
        auVar38 = vfmadd231ps_fma(auVar38,auVar25,auVar46);
        auVar23 = vandps_avx(auVar59,auVar51);
        uVar17 = auVar23._0_4_;
        auVar35._0_4_ = (float)(uVar17 ^ auVar38._0_4_);
        uVar53 = auVar23._4_4_;
        auVar35._4_4_ = (float)(uVar53 ^ auVar38._4_4_);
        uVar54 = auVar23._8_4_;
        auVar35._8_4_ = (float)(uVar54 ^ auVar38._8_4_);
        uVar55 = auVar23._12_4_;
        auVar35._12_4_ = (float)(uVar55 ^ auVar38._12_4_);
        auVar23 = vfmadd231ps_fma(auVar32,auVar24,auVar25);
        auVar32._0_4_ = (float)(uVar17 ^ auVar23._0_4_);
        auVar32._4_4_ = (float)(uVar53 ^ auVar23._4_4_);
        auVar32._8_4_ = (float)(uVar54 ^ auVar23._8_4_);
        auVar32._12_4_ = (float)(uVar55 ^ auVar23._12_4_);
        auVar38 = ZEXT416(0) << 0x20;
        auVar23 = vcmpps_avx(auVar35,auVar38,5);
        auVar24 = vcmpps_avx(auVar32,auVar38,5);
        auVar23 = vandps_avx(auVar23,auVar24);
        auVar46._8_4_ = 0x7fffffff;
        auVar46._0_8_ = 0x7fffffff7fffffff;
        auVar46._12_4_ = 0x7fffffff;
        auVar24 = vandps_avx(auVar59,auVar46);
        auVar38 = vcmpps_avx(auVar59,auVar38,4);
        auVar23 = vandps_avx(auVar23,auVar38);
        auVar59._0_4_ = auVar35._0_4_ + auVar32._0_4_;
        auVar59._4_4_ = auVar35._4_4_ + auVar32._4_4_;
        auVar59._8_4_ = auVar35._8_4_ + auVar32._8_4_;
        auVar59._12_4_ = auVar35._12_4_ + auVar32._12_4_;
        auVar38 = vcmpps_avx(auVar59,auVar24,2);
        auVar46 = auVar38 & auVar23;
        if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          auVar23 = vandps_avx(auVar23,auVar38);
          auVar42._0_4_ = local_1378._0_4_ * auVar43._0_4_;
          auVar42._4_4_ = local_1378._4_4_ * auVar43._4_4_;
          auVar42._8_4_ = local_1378._8_4_ * auVar43._8_4_;
          auVar42._12_4_ = local_1378._12_4_ * auVar43._12_4_;
          auVar38 = vfmadd213ps_fma(auVar33,local_1388,auVar42);
          auVar38 = vfmadd213ps_fma(auVar30,local_1398,auVar38);
          auVar30._0_4_ = (float)(uVar17 ^ auVar38._0_4_);
          auVar30._4_4_ = (float)(uVar53 ^ auVar38._4_4_);
          auVar30._8_4_ = (float)(uVar54 ^ auVar38._8_4_);
          auVar30._12_4_ = (float)(uVar55 ^ auVar38._12_4_);
          fVar1 = *(float *)(ray + k * 4 + 0x30);
          auVar33._0_4_ = auVar24._0_4_ * fVar1;
          auVar33._4_4_ = auVar24._4_4_ * fVar1;
          auVar33._8_4_ = auVar24._8_4_ * fVar1;
          auVar33._12_4_ = auVar24._12_4_ * fVar1;
          auVar38 = vcmpps_avx(auVar33,auVar30,1);
          fVar1 = *(float *)(ray + k * 4 + 0x80);
          auVar43._0_4_ = auVar24._0_4_ * fVar1;
          auVar43._4_4_ = auVar24._4_4_ * fVar1;
          auVar43._8_4_ = auVar24._8_4_ * fVar1;
          auVar43._12_4_ = auVar24._12_4_ * fVar1;
          auVar46 = vcmpps_avx(auVar30,auVar43,2);
          auVar38 = vandps_avx(auVar38,auVar46);
          auVar23 = vandps_avx(auVar23,auVar38);
          uVar17 = vmovmskps_avx(auVar23);
          if (uVar17 != 0) {
            local_1478 = context->scene;
            auVar23 = vrcpps_avx(auVar24);
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar24 = vfnmadd213ps_fma(auVar24,auVar23,auVar28);
            auVar23 = vfmadd132ps_fma(auVar24,auVar23,auVar23);
            fVar45 = auVar23._0_4_;
            fVar48 = auVar23._4_4_;
            fVar49 = auVar23._8_4_;
            fVar50 = auVar23._12_4_;
            local_13a8[0] = fVar45 * auVar30._0_4_;
            local_13a8[1] = fVar48 * auVar30._4_4_;
            local_13a8[2] = fVar49 * auVar30._8_4_;
            local_13a8[3] = fVar50 * auVar30._12_4_;
            local_13c8[0] = fVar45 * auVar35._0_4_;
            local_13c8[1] = fVar48 * auVar35._4_4_;
            local_13c8[2] = fVar49 * auVar35._8_4_;
            local_13c8[3] = fVar50 * auVar35._12_4_;
            local_13b8._0_4_ = fVar45 * auVar32._0_4_;
            local_13b8._4_4_ = fVar48 * auVar32._4_4_;
            local_13b8._8_4_ = fVar49 * auVar32._8_4_;
            local_13b8._12_4_ = fVar50 * auVar32._12_4_;
            uVar15 = (ulong)(uVar17 & 0xff);
            do {
              uVar11 = 0;
              for (uVar16 = uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                uVar11 = uVar11 + 1;
              }
              uVar17 = *(uint *)(lVar13 + uVar12 + 0x120 + uVar11 * 4);
              pGVar5 = (local_1478->geometries).items[uVar17].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005cdf36:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar22;
                }
                uVar16 = (ulong)(uint)((int)uVar11 * 4);
                local_1338 = *(undefined4 *)((long)local_13c8 + uVar16);
                uVar3 = *(undefined4 *)(local_13b8 + uVar16);
                local_1328._4_4_ = uVar3;
                local_1328._0_4_ = uVar3;
                local_1328._8_4_ = uVar3;
                local_1328._12_4_ = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar16);
                args.context = context->user;
                local_1308._4_4_ = uVar17;
                local_1308._0_4_ = uVar17;
                local_1308._8_4_ = uVar17;
                local_1308._12_4_ = uVar17;
                uVar3 = *(undefined4 *)(lVar13 + uVar12 + 0x130 + uVar16);
                local_1318._4_4_ = uVar3;
                local_1318._0_4_ = uVar3;
                local_1318._8_4_ = uVar3;
                local_1318._12_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_1398 + uVar16);
                uVar4 = *(undefined4 *)(local_1388 + uVar16);
                local_1358._4_4_ = uVar4;
                local_1358._0_4_ = uVar4;
                local_1358._8_4_ = uVar4;
                local_1358._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1378 + uVar16);
                local_1348._4_4_ = uVar4;
                local_1348._0_4_ = uVar4;
                local_1348._8_4_ = uVar4;
                local_1348._12_4_ = uVar4;
                local_1368[0] = (RTCHitN)(char)uVar3;
                local_1368[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1368[4] = (RTCHitN)(char)uVar3;
                local_1368[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1368[8] = (RTCHitN)(char)uVar3;
                local_1368[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_1368[0xc] = (RTCHitN)(char)uVar3;
                local_1368[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_1368[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_1368[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_1334 = local_1338;
                uStack_1330 = local_1338;
                uStack_132c = local_1338;
                vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                uStack_12f4 = (args.context)->instID[0];
                local_12f8 = uStack_12f4;
                uStack_12f0 = uStack_12f4;
                uStack_12ec = uStack_12f4;
                uStack_12e8 = (args.context)->instPrimID[0];
                uStack_12e4 = uStack_12e8;
                uStack_12e0 = uStack_12e8;
                uStack_12dc = uStack_12e8;
                local_14a8 = *local_1470;
                args.valid = (int *)local_14a8;
                args.geometryUserPtr = pGVar5->userPtr;
                args.hit = local_1368;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar5->occlusionFilterN)(&args);
                }
                if (local_14a8 == (undefined1  [16])0x0) {
                  auVar23 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar23 = auVar23 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)(&args);
                  }
                  auVar24 = vpcmpeqd_avx(local_14a8,_DAT_01f7aa10);
                  auVar23 = auVar24 ^ _DAT_01f7ae20;
                  auVar31._8_4_ = 0xff800000;
                  auVar31._0_8_ = 0xff800000ff800000;
                  auVar31._12_4_ = 0xff800000;
                  auVar24 = vblendvps_avx(auVar31,*(undefined1 (*) [16])(args.ray + 0x80),auVar24);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar24;
                }
                auVar29._8_8_ = 0x100000001;
                auVar29._0_8_ = 0x100000001;
                if ((auVar29 & auVar23) != (undefined1  [16])0x0) goto LAB_005cdf36;
                *(float *)(ray + k * 4 + 0x80) = fVar1;
              }
              uVar15 = uVar15 ^ 1L << (uVar11 & 0x3f);
            } while (uVar15 != 0);
          }
        }
        local_1498 = local_1498 + 1;
      } while (local_1498 != local_1490);
    }
    bVar22 = local_1480 != stack;
    auVar34 = ZEXT3264(local_11f8);
    auVar36 = ZEXT3264(local_1218);
    auVar40 = ZEXT3264(local_1238);
    auVar44 = ZEXT3264(local_1258);
    auVar47 = ZEXT3264(local_1278);
    auVar52 = ZEXT3264(local_1298);
    auVar57 = ZEXT3264(local_12b8);
    auVar60 = ZEXT3264(local_12d8);
    if (!bVar22) {
      return bVar22;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }